

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O3

int __thiscall QTimeEdit::qt_metacall(QTimeEdit *this,Call _c,int _id,void **_a)

{
  int _id_00;
  QTimeEdit *_t;
  long in_FS_OFFSET;
  undefined4 local_3c;
  void *local_38;
  undefined4 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _id_00 = QDateTimeEdit::qt_metacall(&this->super_QDateTimeEdit,_c,_id,_a);
  if ((-1 < _id_00) && (_c < CustomCall)) {
    if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
      if (_c == InvokeMetaMethod) {
        if (_id_00 == 0) {
          local_3c = *_a[1];
          local_30 = &local_3c;
          local_38 = (void *)0x0;
          QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
        }
      }
      else {
        if (_c != RegisterMethodArgumentMetaType) goto LAB_003eaf6b;
        if (_id_00 == 0) {
          *(undefined8 *)*_a = 0;
        }
      }
    }
    else {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
    }
    _id_00 = _id_00 + -1;
  }
LAB_003eaf6b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return _id_00;
  }
  __stack_chk_fail();
}

Assistant:

int QTimeEdit::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDateTimeEdit::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    return _id;
}